

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void it_playing_reset_resamplers(IT_PLAYING *playing,int32 pos)

{
  int iVar1;
  int iVar2;
  IT_SAMPLE *pIVar3;
  int quality;
  
  pIVar3 = playing->sample;
  iVar1 = playing->resampling_quality;
  iVar2 = pIVar3->max_resampling_quality;
  quality = iVar2;
  if (iVar1 < iVar2) {
    quality = iVar1;
  }
  if (iVar2 < 0) {
    quality = iVar1;
  }
  dumb_reset_resampler_n
            ((pIVar3->flags & 2) * 4 + 8,&playing->resampler,pIVar3->data,
             2 - (uint)((pIVar3->flags & 4) == 0),pos,0,0,quality);
  (playing->resampler).pickup_data = playing;
  playing->time_lost = 0;
  *(byte *)&playing->flags = (byte)playing->flags & 0xf7;
  it_playing_update_resamplers(playing);
  return;
}

Assistant:

static void it_playing_reset_resamplers(IT_PLAYING *playing, int32 pos)
{
	int bits = playing->sample->flags & IT_SAMPLE_16BIT ? 16 : 8;
	int quality = playing->resampling_quality;
	int channels = playing->sample->flags & IT_SAMPLE_STEREO ? 2 : 1;
	if (playing->sample->max_resampling_quality >= 0 && quality > playing->sample->max_resampling_quality)
		quality = playing->sample->max_resampling_quality;
	dumb_reset_resampler_n(bits, &playing->resampler, playing->sample->data, channels, pos, 0, 0, quality);
	playing->resampler.pickup_data = playing;
	playing->time_lost = 0;
	playing->flags &= ~IT_PLAYING_DEAD;
	it_playing_update_resamplers(playing);
}